

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O0

long mkvparser::UnserializeFloat(IMkvReader *pReader,longlong pos,longlong size_,double *result)

{
  int iVar1;
  uint uVar2;
  long lVar3;
  int local_64;
  ulong uStack_60;
  int i_1;
  double d;
  float fStack_50;
  int i;
  float f;
  byte local_40 [4];
  int status;
  uchar buf [8];
  long size;
  double *result_local;
  longlong size__local;
  longlong pos_local;
  IMkvReader *pReader_local;
  
  if (((pReader == (IMkvReader *)0x0) || (pos < 0)) || ((size_ != 4 && (size_ != 8)))) {
    pReader_local = (IMkvReader *)0xfffffffffffffffe;
  }
  else {
    buf = (uchar  [8])size_;
    iVar1 = (**pReader->_vptr_IMkvReader)(pReader,pos,size_,local_40);
    if (iVar1 < 0) {
      pReader_local = (IMkvReader *)(long)iVar1;
    }
    else {
      if (buf == (uchar  [8])0x4) {
        _fStack_50 = 0;
        d._4_4_ = 0;
        while( true ) {
          lVar3 = (long)d._4_4_;
          d._4_4_ = d._4_4_ + 1;
          if (3 < d._4_4_) break;
          _fStack_50 = (local_40[lVar3] | _fStack_50) << 8;
        }
        fStack_50 = (float)(local_40[lVar3] | _fStack_50);
        *result = (double)fStack_50;
      }
      else {
        uStack_60 = 0;
        local_64 = 0;
        while( true ) {
          lVar3 = (long)local_64;
          local_64 = local_64 + 1;
          if (7 < local_64) break;
          uStack_60 = (local_40[lVar3] | uStack_60) << 8;
        }
        *result = (double)(local_40[lVar3] | uStack_60);
      }
      uVar2 = isinf(*result);
      if (((uVar2 & 1) == 0) && (uVar2 = isnan(*result), (uVar2 & 1) == 0)) {
        return 0;
      }
      pReader_local = (IMkvReader *)0xfffffffffffffffe;
    }
  }
  return (long)pReader_local;
}

Assistant:

long UnserializeFloat(IMkvReader* pReader, long long pos, long long size_,
                      double& result) {
  if (!pReader || pos < 0 || ((size_ != 4) && (size_ != 8)))
    return E_FILE_FORMAT_INVALID;

  const long size = static_cast<long>(size_);

  unsigned char buf[8];

  const int status = pReader->Read(pos, size, buf);

  if (status < 0)  // error
    return status;

  if (size == 4) {
    union {
      float f;
      unsigned long ff;
    };

    ff = 0;

    for (int i = 0;;) {
      ff |= buf[i];

      if (++i >= 4)
        break;

      ff <<= 8;
    }

    result = f;
  } else {
    union {
      double d;
      unsigned long long dd;
    };

    dd = 0;

    for (int i = 0;;) {
      dd |= buf[i];

      if (++i >= 8)
        break;

      dd <<= 8;
    }

    result = d;
  }

  if (mkvparser::isinf(result) || mkvparser::isnan(result))
    return E_FILE_FORMAT_INVALID;

  return 0;
}